

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O0

string * __thiscall Pl_SHA2::getRawDigest_abi_cxx11_(string *__return_storage_ptr__,Pl_SHA2 *this)

{
  logic_error *this_00;
  element_type *peVar1;
  Pl_SHA2 *this_local;
  
  if ((this->in_progress & 1U) != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"digest requested for in-progress SHA2 Pipeline");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar1 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->crypto);
  (*peVar1->_vptr_QPDFCryptoImpl[10])(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
Pl_SHA2::getRawDigest()
{
    if (this->in_progress) {
        throw std::logic_error("digest requested for in-progress SHA2 Pipeline");
    }
    return this->crypto->SHA2_digest();
}